

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool aedit_type(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  int type;
  AREA_DATA_conflict *pArea;
  flag_type *flag_table;
  bool local_1;
  
  flag_table = *(flag_type **)(*(long *)(in_RDI + 0x80) + 0x6c60);
  if (*(char *)&in_RSI->next == '\0') {
    send_to_char(in_RDI,in_RSI);
    local_1 = false;
  }
  else {
    iVar1 = flag_lookup((char *)in_RSI,flag_table);
    if (iVar1 == -99) {
      send_to_char(in_RDI,in_RSI);
      local_1 = false;
    }
    else {
      *(short *)&flag_table[3].field_0x14 = (short)iVar1;
      send_to_char(in_RDI,in_RSI);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool aedit_type(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	int type = 0;

	EDIT_AREA(ch, pArea);

	if (!*argument)
	{
		send_to_char("Syntax:  type <type>\n\r", ch);
		return false;
	}

	type = flag_lookup(argument, area_type_table);
	if (type == NO_FLAG)
	{
		send_to_char("Not a valid type.\n\r", ch);
		return false;
	}

	pArea->area_type = type;
	send_to_char("Type set.\n\r", ch);

	return true;
}